

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

void __thiscall Generator::generateStaticMetacall(Generator *this)

{
  bool bVar1;
  bool bVar2;
  Int IVar3;
  char *pcVar4;
  qsizetype qVar5;
  char *pcVar6;
  const_reference pFVar7;
  char *pcVar8;
  uint *puVar9;
  PropertyDef *pPVar10;
  const_reference pPVar11;
  char *pcVar12;
  long in_RDI;
  long in_FS_OFFSET;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  QStringBuilder<const_QByteArray_&,_char> QVar17;
  PropertyDef *p_4;
  int propindex_3;
  PropertyDef *p_3;
  int propindex_2;
  FunctionDef *f_2;
  PropertyDef *p_2;
  int propindex_1;
  PropertyDef *p_1;
  int propindex;
  PropertyDef *p;
  add_const_t<QList<PropertyDef>_> *__range2;
  bool hasBindableProperties;
  bool needReset;
  bool needSet;
  bool needTempVarForGet;
  bool needGet;
  QByteArray *lastKey_1;
  ArgumentDef *a_1;
  FunctionDef *f_1;
  int methodindex_1;
  QByteArray *lastKey;
  ArgumentDef *a;
  int offset;
  FunctionDef *f;
  int methodindex;
  int ctorindex_1;
  int ctorindex;
  int ctorend;
  anon_class_16_2_a78287bd printUnused;
  QByteArray prefix_3;
  QByteArray prefix_2;
  QByteArray prefix_1;
  QFlags<QtMocConstants::EnumFlags> eflags;
  QByteArray prefix;
  const_iterator __end2;
  const_iterator __begin2;
  const_iterator end_3;
  const_iterator it_3;
  QMultiMap<QByteArray,_int> automaticPropertyMetaTypes;
  const_iterator it_2;
  const_iterator end_2;
  const_iterator begin_1;
  const_iterator jend;
  const_iterator jt;
  const_iterator end_1;
  const_iterator it_1;
  QMap<int,_QMultiMap<QByteArray,_int>_> methodsWithAutomaticTypes;
  const_iterator it;
  const_iterator end;
  const_iterator begin;
  QList<FunctionDef> methodList;
  anon_class_8_1_8991fb9c generateCtorArguments;
  uint usedArgs;
  QStringBuilder<QStringBuilder<const_QByteArray_&,_char>,_const_QByteArray_&>
  *in_stack_fffffffffffffa18;
  QStringBuilder<const_QByteArray_&,_char> *in_stack_fffffffffffffa20;
  QByteArray *in_stack_fffffffffffffa28;
  UsedArgs entry;
  FILE *in_stack_fffffffffffffa30;
  undefined4 in_stack_fffffffffffffa38;
  QFlagsStorage<TypeTag> in_stack_fffffffffffffa3c;
  uint uVar18;
  QByteArray *in_stack_fffffffffffffa40;
  Generator *in_stack_fffffffffffffa50;
  FILE *pFVar19;
  QList<FunctionDef> *in_stack_fffffffffffffa60;
  undefined4 in_stack_fffffffffffffa68;
  undefined4 in_stack_fffffffffffffa6c;
  byte local_40c;
  byte local_40b;
  byte local_409;
  byte local_341;
  uint local_314;
  uint local_304;
  uint local_2ec;
  uint local_2dc;
  uint local_2a4;
  uint local_280;
  uint local_27c;
  uint local_278;
  uint *local_268 [3];
  QStringBuilder<const_QByteArray_&,_const_char_(&)[3]> local_250;
  undefined1 *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  QStringBuilder<const_QByteArray_&,_const_char_(&)[3]> local_228;
  undefined1 *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  Int local_200;
  Int local_1fc;
  Int local_1f8;
  Int local_1f4;
  char *local_1f0;
  QStringBuilder<const_QByteArray_&,_const_char_(&)[3]> local_1e8;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  Int local_1bc;
  Int local_1b8;
  Int local_1b4;
  char *local_1b0;
  QFlagsStorageHelper<QtMocConstants::EnumFlags,_4> local_1a4;
  undefined1 local_1a0 [4];
  QFlagsStorageHelper<QtMocConstants::EnumFlags,_4> local_19c;
  QStringBuilder<const_QByteArray_&,_const_char_(&)[3]> local_198;
  undefined1 *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  PropertyDef *local_170;
  const_iterator local_168;
  const_iterator local_160;
  const_iterator local_158;
  const_iterator local_150;
  undefined1 *local_148;
  QByteArray *local_140;
  char local_138;
  undefined1 local_129;
  ArgumentDef *local_110;
  ArgumentDef *local_108;
  const_iterator local_100;
  const_iterator local_f8;
  const_iterator local_f0;
  const_iterator local_e8;
  const_iterator local_e0;
  const_iterator local_d8;
  const_iterator local_d0;
  undefined1 *local_c8;
  char *local_a8;
  ArgumentDef *local_a0;
  ArgumentDef *local_98;
  const_iterator local_90;
  const_iterator local_88;
  const_iterator local_80;
  char *local_60;
  QList<FunctionDef> local_58;
  uint local_34;
  QByteArray *local_30;
  char local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pFVar19 = *(FILE **)(in_RDI + 8);
  pcVar4 = QByteArray::constData((QByteArray *)0x10de9d);
  fprintf(pFVar19,
          "void %s::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)\n{\n",
          pcVar4);
  local_34 = 0;
  if ((*(byte *)(*(long *)(in_RDI + 0x10) + 0x1a4) & 1) == 0) {
    pFVar19 = *(FILE **)(in_RDI + 8);
    pcVar4 = QByteArray::constData((QByteArray *)0x10df2b);
    fprintf(pFVar19,"    auto *_t = reinterpret_cast<%s *>(_o);\n",pcVar4);
  }
  else {
    pFVar19 = *(FILE **)(in_RDI + 8);
    pcVar4 = QByteArray::constData((QByteArray *)0x10def3);
    fprintf(pFVar19,"    auto *_t = static_cast<%s *>(_o);\n",pcVar4);
  }
  bVar1 = QList<FunctionDef>::isEmpty((QList<FunctionDef> *)0x10df73);
  if (!bVar1) {
    fprintf(*(FILE **)(in_RDI + 8),"    if (_c == QMetaObject::CreateInstance) {\n");
    fprintf(*(FILE **)(in_RDI + 8),"        switch (_id) {\n");
    qVar5 = QList<FunctionDef>::size((QList<FunctionDef> *)(*(long *)(in_RDI + 0x10) + 0xf8));
    for (local_278 = 0; (int)local_278 < (int)qVar5; local_278 = local_278 + 1) {
      pFVar19 = *(FILE **)(in_RDI + 8);
      pcVar4 = QByteArray::constData((QByteArray *)0x10e018);
      pcVar6 = QByteArray::constData((QByteArray *)0x10e034);
      fprintf(pFVar19,"        case %d: { %s *_r = new %s(",(ulong)local_278,pcVar4,pcVar6);
      generateStaticMetacall::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c.i);
      fprintf(*(FILE **)(in_RDI + 8),");\n");
      local_341 = 1;
      if ((*(byte *)(*(long *)(in_RDI + 0x10) + 0x1a5) & 1) == 0) {
        local_341 = *(byte *)(*(long *)(in_RDI + 0x10) + 0x1a6);
      }
      pcVar4 = "QObject";
      if ((local_341 & 1) != 0) {
        pcVar4 = "void";
      }
      fprintf(*(FILE **)(in_RDI + 8),
              "            if (_a[0]) *reinterpret_cast<%s**>(_a[0]) = _r; } break;\n",pcVar4);
    }
    fprintf(*(FILE **)(in_RDI + 8),"        default: break;\n");
    fprintf(*(FILE **)(in_RDI + 8),"        }\n");
    fprintf(*(FILE **)(in_RDI + 8),"    }\n");
    fprintf(*(FILE **)(in_RDI + 8),"    if (_c == QMetaObject::ConstructInPlace) {\n");
    fprintf(*(FILE **)(in_RDI + 8),"        switch (_id) {\n");
    for (local_27c = 0; (int)local_27c < (int)qVar5; local_27c = local_27c + 1) {
      pFVar19 = *(FILE **)(in_RDI + 8);
      pcVar4 = QByteArray::constData((QByteArray *)0x10e1e1);
      fprintf(pFVar19,"        case %d: { new (_a[0]) %s(",(ulong)local_27c,pcVar4);
      generateStaticMetacall::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c.i);
      fprintf(*(FILE **)(in_RDI + 8),"); } break;\n");
    }
    fprintf(*(FILE **)(in_RDI + 8),"        default: break;\n");
    fprintf(*(FILE **)(in_RDI + 8),"        }\n");
    fprintf(*(FILE **)(in_RDI + 8),"    }\n");
    local_34 = local_34 | 0xe;
  }
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (FunctionDef *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<FunctionDef>::QList((QList<FunctionDef> *)0x10e2de);
  QList<FunctionDef>::operator+=
            ((QList<FunctionDef> *)in_stack_fffffffffffffa20,
             (QList<FunctionDef> *)in_stack_fffffffffffffa18);
  QList<FunctionDef>::operator+=
            ((QList<FunctionDef> *)in_stack_fffffffffffffa20,
             (QList<FunctionDef> *)in_stack_fffffffffffffa18);
  QList<FunctionDef>::operator+=
            ((QList<FunctionDef> *)in_stack_fffffffffffffa20,
             (QList<FunctionDef> *)in_stack_fffffffffffffa18);
  bVar1 = QList<FunctionDef>::isEmpty((QList<FunctionDef> *)0x10e34b);
  if (!bVar1) {
    local_34 = local_34 | 7;
    fprintf(*(FILE **)(in_RDI + 8),"    if (_c == QMetaObject::InvokeMetaMethod) {\n");
    fprintf(*(FILE **)(in_RDI + 8),"        switch (_id) {\n");
    for (local_280 = 0; qVar5 = QList<FunctionDef>::size(&local_58), (int)local_280 < qVar5;
        local_280 = local_280 + 1) {
      pFVar7 = QList<FunctionDef>::at
                         ((QList<FunctionDef> *)in_stack_fffffffffffffa20,
                          (qsizetype)in_stack_fffffffffffffa18);
      fprintf(*(FILE **)(in_RDI + 8),"        case %d: ",(ulong)local_280);
      local_60 = "void";
      bVar1 = ::operator!=((QByteArray *)
                           CONCAT44(in_stack_fffffffffffffa3c.i,in_stack_fffffffffffffa38),
                           (char **)in_stack_fffffffffffffa30);
      if (bVar1) {
        pFVar19 = *(FILE **)(in_RDI + 8);
        noRef(in_stack_fffffffffffffa40);
        pcVar4 = QByteArray::constData((QByteArray *)0x10e48f);
        fprintf(pFVar19,"{ %s _r = ",pcVar4);
        QByteArray::~QByteArray((QByteArray *)0x10e4b5);
      }
      fprintf(*(FILE **)(in_RDI + 8),"_t->");
      qVar5 = QByteArray::size(&pFVar7->inPrivateClass);
      if (qVar5 != 0) {
        pFVar19 = *(FILE **)(in_RDI + 8);
        pcVar4 = QByteArray::constData((QByteArray *)0x10e511);
        fprintf(pFVar19,"%s->",pcVar4);
      }
      pFVar19 = *(FILE **)(in_RDI + 8);
      pcVar4 = QByteArray::constData((QByteArray *)0x10e552);
      fprintf(pFVar19,"%s(",pcVar4);
      if ((pFVar7->isRawSlot & 1U) == 0) {
        local_80.i = (ArgumentDef *)&DAT_aaaaaaaaaaaaaaaa;
        local_80 = QList<ArgumentDef>::cbegin((QList<ArgumentDef> *)in_stack_fffffffffffffa20);
        local_88.i = (ArgumentDef *)&DAT_aaaaaaaaaaaaaaaa;
        local_88 = QList<ArgumentDef>::cend((QList<ArgumentDef> *)in_stack_fffffffffffffa20);
        local_90.i = local_80.i;
        while( true ) {
          local_98 = local_88.i;
          bVar1 = QList<ArgumentDef>::const_iterator::operator!=(&local_90,local_88);
          if (!bVar1) break;
          QList<ArgumentDef>::const_iterator::operator*(&local_90);
          local_a0 = local_80.i;
          bVar1 = QList<ArgumentDef>::const_iterator::operator!=(&local_90,local_80);
          if (bVar1) {
            fprintf(*(FILE **)(in_RDI + 8),",");
          }
          pFVar19 = *(FILE **)(in_RDI + 8);
          pcVar4 = QByteArray::constData((QByteArray *)0x10e6e8);
          fprintf(pFVar19,"(*reinterpret_cast< %s>(_a[%d]))",pcVar4);
          local_34 = local_34 | 8;
          QList<ArgumentDef>::const_iterator::operator++(&local_90);
        }
        if ((pFVar7->isPrivateSignal & 1U) != 0) {
          bVar1 = QList<ArgumentDef>::isEmpty((QList<ArgumentDef> *)0x10e759);
          if (!bVar1) {
            fprintf(*(FILE **)(in_RDI + 8),", ");
          }
          fprintf(*(FILE **)(in_RDI + 8),"%s","QPrivateSignal()");
        }
      }
      else {
        fprintf(*(FILE **)(in_RDI + 8),"QMethodRawArguments{ _a }");
        local_34 = local_34 | 8;
      }
      fprintf(*(FILE **)(in_RDI + 8),");");
      local_a8 = "void";
      bVar1 = ::operator!=((QByteArray *)
                           CONCAT44(in_stack_fffffffffffffa3c.i,in_stack_fffffffffffffa38),
                           (char **)in_stack_fffffffffffffa30);
      if (bVar1) {
        pFVar19 = *(FILE **)(in_RDI + 8);
        noRef(in_stack_fffffffffffffa40);
        pcVar4 = QByteArray::constData((QByteArray *)0x10e81c);
        fprintf(pFVar19,
                "\n            if (_a[0]) *reinterpret_cast< %s*>(_a[0]) = std::move(_r); } ",pcVar4
               );
        QByteArray::~QByteArray((QByteArray *)0x10e842);
        local_34 = local_34 | 8;
      }
      fprintf(*(FILE **)(in_RDI + 8)," break;\n");
    }
    fprintf(*(FILE **)(in_RDI + 8),"        default: ;\n");
    fprintf(*(FILE **)(in_RDI + 8),"        }\n");
    fprintf(*(FILE **)(in_RDI + 8),"    }\n");
    local_c8 = &DAT_aaaaaaaaaaaaaaaa;
    methodsWithAutomaticTypesHelper
              ((Generator *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
               in_stack_fffffffffffffa60);
    bVar1 = QMap<int,_QMultiMap<QByteArray,_int>_>::isEmpty
                      ((QMap<int,_QMultiMap<QByteArray,_int>_> *)in_stack_fffffffffffffa20);
    if (!bVar1) {
      fprintf(*(FILE **)(in_RDI + 8),
              "    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {\n");
      fprintf(*(FILE **)(in_RDI + 8),"        switch (_id) {\n");
      fprintf(*(FILE **)(in_RDI + 8),
              "        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;\n");
      local_d0._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
      local_d0._M_node =
           (_Base_ptr)
           QMap<int,_QMultiMap<QByteArray,_int>_>::constBegin
                     ((QMap<int,_QMultiMap<QByteArray,_int>_> *)in_stack_fffffffffffffa18);
      local_d8._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
      local_d8._M_node =
           (_Base_ptr)
           QMap<int,_QMultiMap<QByteArray,_int>_>::constEnd
                     ((QMap<int,_QMultiMap<QByteArray,_int>_> *)in_stack_fffffffffffffa18);
      while (bVar1 = ::operator!=((const_iterator *)in_stack_fffffffffffffa20,
                                  (const_iterator *)in_stack_fffffffffffffa18), bVar1) {
        pFVar19 = *(FILE **)(in_RDI + 8);
        puVar9 = (uint *)QMap<int,_QMultiMap<QByteArray,_int>_>::const_iterator::key
                                   ((const_iterator *)0x10e9e7);
        fprintf(pFVar19,"        case %d:\n",(ulong)*puVar9);
        fprintf(*(FILE **)(in_RDI + 8),"            switch (*reinterpret_cast<int*>(_a[1])) {\n");
        fprintf(*(FILE **)(in_RDI + 8),
                "            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;\n"
               );
        local_e0._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
        QMap<int,_QMultiMap<QByteArray,_int>_>::const_iterator::operator->
                  ((const_iterator *)0x10ea4f);
        local_e0._M_node =
             (_Base_ptr)
             QMultiMap<QByteArray,_int>::begin
                       ((QMultiMap<QByteArray,_int> *)in_stack_fffffffffffffa30);
        local_e8._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
        QMap<int,_QMultiMap<QByteArray,_int>_>::const_iterator::operator->
                  ((const_iterator *)0x10ea7b);
        local_e8._M_node =
             (_Base_ptr)
             QMultiMap<QByteArray,_int>::end
                       ((QMultiMap<QByteArray,_int> *)in_stack_fffffffffffffa30);
LAB_0010ea8b:
        bVar1 = ::operator!=((const_iterator *)in_stack_fffffffffffffa20,
                             (const_iterator *)in_stack_fffffffffffffa18);
        if (bVar1) {
          pFVar19 = *(FILE **)(in_RDI + 8);
          puVar9 = (uint *)QMultiMap<QByteArray,_int>::const_iterator::value
                                     ((const_iterator *)0x10eaca);
          fprintf(pFVar19,"            case %d:\n",(ulong)*puVar9);
          QMultiMap<QByteArray,_int>::const_iterator::key((const_iterator *)0x10eb01);
          QMultiMap<QByteArray,_int>::const_iterator::operator++
                    ((const_iterator *)in_stack_fffffffffffffa20);
          bVar1 = ::operator==((const_iterator *)in_stack_fffffffffffffa20,
                               (const_iterator *)in_stack_fffffffffffffa18);
          if (!bVar1) goto code_r0x0010eb2f;
          goto LAB_0010eb52;
        }
        fprintf(*(FILE **)(in_RDI + 8),"            }\n");
        fprintf(*(FILE **)(in_RDI + 8),"            break;\n");
        QMap<int,_QMultiMap<QByteArray,_int>_>::const_iterator::operator++
                  ((const_iterator *)in_stack_fffffffffffffa20);
      }
      fprintf(*(FILE **)(in_RDI + 8),"        }\n");
      fprintf(*(FILE **)(in_RDI + 8),"    }\n");
      local_34 = local_34 | 0xe;
    }
    QMap<int,_QMultiMap<QByteArray,_int>_>::~QMap
              ((QMap<int,_QMultiMap<QByteArray,_int>_> *)0x10ec29);
  }
  bVar1 = QList<FunctionDef>::isEmpty((QList<FunctionDef> *)0x10ec41);
  if (!bVar1) {
    local_34 = local_34 | 10;
    fprintf(*(FILE **)(in_RDI + 8),"    if (_c == QMetaObject::IndexOfMethod) {\n");
    for (local_2a4 = 0;
        qVar5 = QList<FunctionDef>::size((QList<FunctionDef> *)(*(long *)(in_RDI + 0x10) + 0x110)),
        (int)local_2a4 < (int)qVar5; local_2a4 = local_2a4 + 1) {
      pFVar7 = QList<FunctionDef>::at
                         ((QList<FunctionDef> *)in_stack_fffffffffffffa20,
                          (qsizetype)in_stack_fffffffffffffa18);
      if ((((pFVar7->wasCloned & 1U) == 0) &&
          (bVar1 = QByteArray::isEmpty((QByteArray *)0x10ed16), bVar1)) &&
         ((pFVar7->isStatic & 1U) == 0)) {
        pFVar19 = *(FILE **)(in_RDI + 8);
        pcVar4 = QByteArray::constData((QByteArray *)0x10ed57);
        pcVar6 = QByteArray::constData((QByteArray *)0x10ed73);
        fprintf(pFVar19,"        if (QtMocHelpers::indexOfMethod<%s (%s::*)(",pcVar4,pcVar6);
        local_f0.i = (ArgumentDef *)&DAT_aaaaaaaaaaaaaaaa;
        local_f0 = QList<ArgumentDef>::cbegin((QList<ArgumentDef> *)in_stack_fffffffffffffa20);
        local_f8.i = (ArgumentDef *)&DAT_aaaaaaaaaaaaaaaa;
        local_f8 = QList<ArgumentDef>::cend((QList<ArgumentDef> *)in_stack_fffffffffffffa20);
        local_100.i = local_f0.i;
        while( true ) {
          local_108 = local_f8.i;
          bVar1 = QList<ArgumentDef>::const_iterator::operator!=(&local_100,local_f8);
          if (!bVar1) break;
          QList<ArgumentDef>::const_iterator::operator*(&local_100);
          local_110 = local_f0.i;
          bVar1 = QList<ArgumentDef>::const_iterator::operator!=(&local_100,local_f0);
          if (bVar1) {
            fprintf(*(FILE **)(in_RDI + 8),", ");
          }
          pFVar19 = *(FILE **)(in_RDI + 8);
          local_129 = 0x20;
          QVar17 = ::operator+(in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20);
          local_140 = QVar17.a;
          local_138 = QVar17.b;
          local_30 = local_140;
          local_28 = local_138;
          ::operator+(in_stack_fffffffffffffa20,(QByteArray *)in_stack_fffffffffffffa18);
          ::QStringBuilder::operator_cast_to_QByteArray(in_stack_fffffffffffffa18);
          pcVar4 = QByteArray::constData((QByteArray *)0x10ef3e);
          fprintf(pFVar19,"%s",pcVar4);
          QByteArray::~QByteArray((QByteArray *)0x10ef64);
          QList<ArgumentDef>::const_iterator::operator++(&local_100);
        }
        if ((pFVar7->isPrivateSignal & 1U) != 0) {
          bVar1 = QList<ArgumentDef>::isEmpty((QList<ArgumentDef> *)0x10ef98);
          if (!bVar1) {
            fprintf(*(FILE **)(in_RDI + 8),", ");
          }
          fprintf(*(FILE **)(in_RDI + 8),"%s","QPrivateSignal");
        }
        pFVar19 = *(FILE **)(in_RDI + 8);
        pcVar4 = "";
        if ((pFVar7->isConst & 1U) != 0) {
          pcVar4 = " const";
        }
        pcVar6 = QByteArray::constData((QByteArray *)0x10f021);
        pcVar8 = QByteArray::constData((QByteArray *)0x10f03d);
        fprintf(pFVar19,")%s>(_a, &%s::%s, %d))\n",pcVar4,pcVar6,pcVar8,(ulong)local_2a4);
        fprintf(*(FILE **)(in_RDI + 8),"            return;\n");
      }
    }
    fprintf(*(FILE **)(in_RDI + 8),"    }\n");
  }
  local_148 = &DAT_aaaaaaaaaaaaaaaa;
  automaticPropertyMetaTypesHelper(in_stack_fffffffffffffa50);
  bVar1 = QMultiMap<QByteArray,_int>::isEmpty
                    ((QMultiMap<QByteArray,_int> *)in_stack_fffffffffffffa20);
  if (!bVar1) {
    fprintf(*(FILE **)(in_RDI + 8),"    if (_c == QMetaObject::RegisterPropertyMetaType) {\n");
    fprintf(*(FILE **)(in_RDI + 8),"        switch (_id) {\n");
    fprintf(*(FILE **)(in_RDI + 8),"        default: *reinterpret_cast<int*>(_a[0]) = -1; break;\n")
    ;
    local_150._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
    local_150._M_node =
         (_Base_ptr)
         QMultiMap<QByteArray,_int>::begin((QMultiMap<QByteArray,_int> *)in_stack_fffffffffffffa30);
    local_158._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
    local_158._M_node =
         (_Base_ptr)
         QMultiMap<QByteArray,_int>::end((QMultiMap<QByteArray,_int> *)in_stack_fffffffffffffa30);
LAB_0010f187:
    bVar1 = ::operator!=((const_iterator *)in_stack_fffffffffffffa20,
                         (const_iterator *)in_stack_fffffffffffffa18);
    if (bVar1) {
      pFVar19 = *(FILE **)(in_RDI + 8);
      puVar9 = (uint *)QMultiMap<QByteArray,_int>::const_iterator::value((const_iterator *)0x10f1c6)
      ;
      fprintf(pFVar19,"        case %d:\n",(ulong)*puVar9);
      QMultiMap<QByteArray,_int>::const_iterator::key((const_iterator *)0x10f1fd);
      QMultiMap<QByteArray,_int>::const_iterator::operator++
                ((const_iterator *)in_stack_fffffffffffffa20);
      bVar1 = ::operator==((const_iterator *)in_stack_fffffffffffffa20,
                           (const_iterator *)in_stack_fffffffffffffa18);
      if (!bVar1) goto code_r0x0010f22b;
      goto LAB_0010f24e;
    }
    fprintf(*(FILE **)(in_RDI + 8),"        }\n");
    fprintf(*(FILE **)(in_RDI + 8),"    }\n");
    local_34 = local_34 | 0xe;
  }
  bVar1 = QList<PropertyDef>::empty((QList<PropertyDef> *)0x10f2ea);
  if (!bVar1) {
    bVar1 = false;
    bVar13 = false;
    bVar14 = false;
    bVar15 = false;
    bVar16 = false;
    local_160.i = (PropertyDef *)&DAT_aaaaaaaaaaaaaaaa;
    local_160 = QList<PropertyDef>::begin((QList<PropertyDef> *)in_stack_fffffffffffffa20);
    local_168.i = (PropertyDef *)&DAT_aaaaaaaaaaaaaaaa;
    local_168 = QList<PropertyDef>::end((QList<PropertyDef> *)in_stack_fffffffffffffa20);
    while( true ) {
      local_170 = local_168.i;
      bVar2 = QList<PropertyDef>::const_iterator::operator!=(&local_160,local_168);
      if (!bVar2) break;
      pPVar10 = QList<PropertyDef>::const_iterator::operator*(&local_160);
      bVar2 = QByteArray::isEmpty((QByteArray *)0x10f3f4);
      local_409 = 1;
      if (bVar2) {
        bVar2 = QByteArray::isEmpty((QByteArray *)0x10f417);
        local_409 = bVar2 ^ 0xff;
      }
      bVar1 = bVar1 || (local_409 & 1) != 0;
      bVar2 = QByteArray::isEmpty((QByteArray *)0x10f45a);
      if ((!bVar2) || (bVar2 = QByteArray::isEmpty((QByteArray *)0x10f471), !bVar2)) {
        bVar2 = false;
        if (pPVar10->gspec != PointerSpec) {
          bVar2 = pPVar10->gspec != ReferenceSpec;
        }
        bVar13 = bVar13 || bVar2;
      }
      bVar2 = QByteArray::isEmpty((QByteArray *)0x10f4e2);
      local_40b = 1;
      if (bVar2) {
        bVar2 = QByteArray::isEmpty((QByteArray *)0x10f505);
        local_40c = 0;
        if (!bVar2) {
          local_40c = pPVar10->constant ^ 0xff;
        }
        local_40b = local_40c;
      }
      bVar14 = bVar14 || (local_40b & 1) != 0;
      bVar2 = QByteArray::isEmpty((QByteArray *)0x10f577);
      bVar15 = bVar15 || ((bVar2 ^ 0xffU) & 1) != 0;
      bVar2 = QByteArray::isEmpty((QByteArray *)0x10f5ac);
      bVar16 = bVar16 || ((bVar2 ^ 0xffU) & 1) != 0;
      QList<PropertyDef>::const_iterator::operator++(&local_160);
    }
    if (((bVar1) || (bVar14)) || ((bVar16 || (bVar15)))) {
      local_34 = local_34 | 7;
    }
    if (((bVar1) || (bVar14)) || (bVar16)) {
      local_34 = local_34 | 8;
    }
    if (bVar1) {
      fprintf(*(FILE **)(in_RDI + 8),"    if (_c == QMetaObject::ReadProperty) {\n");
      if (bVar13) {
        fprintf(*(FILE **)(in_RDI + 8),"        void *_v = _a[0];\n");
      }
      fprintf(*(FILE **)(in_RDI + 8),"        switch (_id) {\n");
      for (local_2dc = 0;
          qVar5 = QList<PropertyDef>::size((QList<PropertyDef> *)(*(long *)(in_RDI + 0x10) + 0x188))
          , (int)local_2dc < (int)qVar5; local_2dc = local_2dc + 1) {
        pPVar11 = QList<PropertyDef>::at
                            ((QList<PropertyDef> *)in_stack_fffffffffffffa20,
                             (qsizetype)in_stack_fffffffffffffa18);
        bVar1 = QByteArray::isEmpty((QByteArray *)0x10f73e);
        if ((!bVar1) || (bVar1 = QByteArray::isEmpty((QByteArray *)0x10f755), !bVar1)) {
          local_188 = &DAT_aaaaaaaaaaaaaaaa;
          local_180 = &DAT_aaaaaaaaaaaaaaaa;
          local_178 = &DAT_aaaaaaaaaaaaaaaa;
          QByteArray::QByteArray
                    ((QByteArray *)in_stack_fffffffffffffa30,(char *)in_stack_fffffffffffffa28,
                     (qsizetype)in_stack_fffffffffffffa20);
          qVar5 = QByteArray::size(&pPVar11->inPrivateClass);
          if (qVar5 != 0) {
            local_198 = ::operator+((QByteArray *)in_stack_fffffffffffffa20,
                                    (char (*) [3])in_stack_fffffffffffffa18);
            ::operator+=((QByteArray *)in_stack_fffffffffffffa20,
                         (QStringBuilder<const_QByteArray_&,_const_char_(&)[3]> *)
                         in_stack_fffffffffffffa18);
          }
          if (pPVar11->gspec == PointerSpec) {
            pFVar19 = *(FILE **)(in_RDI + 8);
            pcVar4 = QByteArray::constData((QByteArray *)0x10f842);
            pcVar6 = QByteArray::constData((QByteArray *)0x10f85b);
            fprintf(pFVar19,
                    "        case %d: _a[0] = const_cast<void*>(reinterpret_cast<const void*>(%s%s())); break;\n"
                    ,(ulong)local_2dc,pcVar4,pcVar6);
          }
          else if (pPVar11->gspec == ReferenceSpec) {
            pFVar19 = *(FILE **)(in_RDI + 8);
            pcVar4 = QByteArray::constData((QByteArray *)0x10f8c8);
            pcVar6 = QByteArray::constData((QByteArray *)0x10f8e1);
            fprintf(pFVar19,
                    "        case %d: _a[0] = const_cast<void*>(reinterpret_cast<const void*>(&%s%s())); break;\n"
                    ,(ulong)local_2dc,pcVar4,pcVar6);
          }
          else {
            local_19c.super_QFlagsStorage<QtMocConstants::EnumFlags>.i =
                 (QFlagsStorage<QtMocConstants::EnumFlags>)0xaaaaaaaa;
            memset(local_1a0,0,4);
            QFlags<QtMocConstants::EnumFlags>::QFlags((QFlags<QtMocConstants::EnumFlags> *)0x10f968)
            ;
            local_19c.super_QFlagsStorage<QtMocConstants::EnumFlags>.i =
                 (QFlagsStorage<QtMocConstants::EnumFlags>)
                 QMap<QByteArray,_QFlags<QtMocConstants::EnumFlags>_>::value
                           ((QMap<QByteArray,_QFlags<QtMocConstants::EnumFlags>_> *)
                            in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,
                            (QFlags<QtMocConstants::EnumFlags> *)in_stack_fffffffffffffa20);
            local_1a4.super_QFlagsStorage<QtMocConstants::EnumFlags>.i =
                 (QFlagsStorage<QtMocConstants::EnumFlags>)
                 QFlags<QtMocConstants::EnumFlags>::operator&
                           ((QFlags<QtMocConstants::EnumFlags> *)in_stack_fffffffffffffa20,
                            (EnumFlags)((ulong)in_stack_fffffffffffffa18 >> 0x20));
            IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_1a4);
            if (IVar3 == 0) {
              local_1b0 = "default";
              bVar1 = ::operator==((QByteArray *)in_stack_fffffffffffffa30,
                                   (char **)in_stack_fffffffffffffa28);
              if (bVar1) {
                pFVar19 = *(FILE **)(in_RDI + 8);
                local_1b4 = (pPVar11->typeTag).super_QFlagsStorageHelper<TypeTag,_4>.
                            super_QFlagsStorage<TypeTag>.i;
                pcVar4 = cxxTypeTag((TypeTags)in_stack_fffffffffffffa3c.i);
                pcVar6 = QByteArray::constData((QByteArray *)0x10fade);
                pcVar8 = QByteArray::constData((QByteArray *)0x10faf3);
                in_stack_fffffffffffffa18 =
                     (QStringBuilder<QStringBuilder<const_QByteArray_&,_char>,_const_QByteArray_&> *
                     )QByteArray::constData((QByteArray *)0x10fb0c);
                fprintf(pFVar19,
                        "        case %d: *reinterpret_cast<%s%s*>(_v) = %s%s().value(); break;\n",
                        (ulong)local_2dc,pcVar4,pcVar6,pcVar8);
              }
              else {
                bVar1 = QByteArray::isEmpty((QByteArray *)0x10fb5b);
                if (bVar1) {
                  pFVar19 = *(FILE **)(in_RDI + 8);
                  local_1bc = (pPVar11->typeTag).super_QFlagsStorageHelper<TypeTag,_4>.
                              super_QFlagsStorage<TypeTag>.i;
                  pcVar4 = cxxTypeTag((TypeTags)in_stack_fffffffffffffa3c.i);
                  pcVar6 = QByteArray::constData((QByteArray *)0x10fc87);
                  pcVar8 = QByteArray::constData((QByteArray *)0x10fc9c);
                  in_stack_fffffffffffffa18 =
                       (QStringBuilder<QStringBuilder<const_QByteArray_&,_char>,_const_QByteArray_&>
                        *)QByteArray::constData((QByteArray *)0x10fcb5);
                  fprintf(pFVar19,"        case %d: *reinterpret_cast<%s%s*>(_v) = %s%s; break;\n",
                          (ulong)local_2dc,pcVar4,pcVar6,pcVar8);
                }
                else {
                  pFVar19 = *(FILE **)(in_RDI + 8);
                  local_1b8 = (pPVar11->typeTag).super_QFlagsStorageHelper<TypeTag,_4>.
                              super_QFlagsStorage<TypeTag>.i;
                  pcVar4 = cxxTypeTag((TypeTags)in_stack_fffffffffffffa3c.i);
                  pcVar6 = QByteArray::constData((QByteArray *)0x10fbbf);
                  pcVar8 = QByteArray::constData((QByteArray *)0x10fbd4);
                  in_stack_fffffffffffffa18 =
                       (QStringBuilder<QStringBuilder<const_QByteArray_&,_char>,_const_QByteArray_&>
                        *)QByteArray::constData((QByteArray *)0x10fbed);
                  fprintf(pFVar19,"        case %d: *reinterpret_cast<%s%s*>(_v) = %s%s(); break;\n"
                          ,(ulong)local_2dc,pcVar4,pcVar6,pcVar8);
                }
              }
            }
            else {
              pFVar19 = *(FILE **)(in_RDI + 8);
              pcVar4 = QByteArray::constData((QByteArray *)0x10f9ee);
              pcVar6 = QByteArray::constData((QByteArray *)0x10fa03);
              pcVar8 = QByteArray::constData((QByteArray *)0x10fa1c);
              fprintf(pFVar19,"        case %d: QtMocHelpers::assignFlags<%s>(_v, %s%s()); break;\n"
                      ,(ulong)local_2dc,pcVar4,pcVar6,pcVar8);
            }
          }
          QByteArray::~QByteArray((QByteArray *)0x10fd03);
        }
      }
      fprintf(*(FILE **)(in_RDI + 8),"        default: break;\n");
      fprintf(*(FILE **)(in_RDI + 8),"        }\n");
      fprintf(*(FILE **)(in_RDI + 8),"    }\n");
    }
    if (bVar14) {
      fprintf(*(FILE **)(in_RDI + 8),"    if (_c == QMetaObject::WriteProperty) {\n");
      fprintf(*(FILE **)(in_RDI + 8),"        void *_v = _a[0];\n");
      fprintf(*(FILE **)(in_RDI + 8),"        switch (_id) {\n");
      for (local_2ec = 0;
          qVar5 = QList<PropertyDef>::size((QList<PropertyDef> *)(*(long *)(in_RDI + 0x10) + 0x188))
          , (int)local_2ec < (int)qVar5; local_2ec = local_2ec + 1) {
        pPVar11 = QList<PropertyDef>::at
                            ((QList<PropertyDef> *)in_stack_fffffffffffffa20,
                             (qsizetype)in_stack_fffffffffffffa18);
        if (((pPVar11->constant & 1U) == 0) &&
           ((bVar1 = QByteArray::isEmpty((QByteArray *)0x10fe67), !bVar1 ||
            (bVar1 = QByteArray::isEmpty((QByteArray *)0x10fe7e), !bVar1)))) {
          local_1d8 = &DAT_aaaaaaaaaaaaaaaa;
          local_1d0 = &DAT_aaaaaaaaaaaaaaaa;
          local_1c8 = &DAT_aaaaaaaaaaaaaaaa;
          QByteArray::QByteArray
                    ((QByteArray *)in_stack_fffffffffffffa30,(char *)in_stack_fffffffffffffa28,
                     (qsizetype)in_stack_fffffffffffffa20);
          qVar5 = QByteArray::size(&pPVar11->inPrivateClass);
          if (qVar5 != 0) {
            local_1e8 = ::operator+((QByteArray *)in_stack_fffffffffffffa20,
                                    (char (*) [3])in_stack_fffffffffffffa18);
            ::operator+=((QByteArray *)in_stack_fffffffffffffa20,
                         (QStringBuilder<const_QByteArray_&,_const_char_(&)[3]> *)
                         in_stack_fffffffffffffa18);
          }
          local_1f0 = "default";
          bVar1 = ::operator==((QByteArray *)in_stack_fffffffffffffa30,
                               (char **)in_stack_fffffffffffffa28);
          if (bVar1) {
            fprintf(*(FILE **)(in_RDI + 8),"        case %d: {\n",(ulong)local_2ec);
            pFVar19 = *(FILE **)(in_RDI + 8);
            pcVar4 = QByteArray::constData((QByteArray *)0x10ff9e);
            pcVar6 = QByteArray::constData((QByteArray *)0x10ffb7);
            local_1f4 = (pPVar11->typeTag).super_QFlagsStorageHelper<TypeTag,_4>.
                        super_QFlagsStorage<TypeTag>.i;
            pcVar8 = cxxTypeTag((TypeTags)in_stack_fffffffffffffa3c.i);
            pcVar12 = QByteArray::constData((QByteArray *)0x10fff9);
            fprintf(pFVar19,"            %s%s().setValue(*reinterpret_cast<%s%s*>(_v));\n",pcVar4,
                    pcVar6,pcVar8,pcVar12);
            fprintf(*(FILE **)(in_RDI + 8),"            break;\n");
            fprintf(*(FILE **)(in_RDI + 8),"        }\n");
          }
          else {
            bVar1 = QByteArray::isEmpty((QByteArray *)0x110074);
            if (bVar1) {
              fprintf(*(FILE **)(in_RDI + 8),"        case %d:",(ulong)local_2ec);
              bVar1 = QByteArray::isEmpty((QByteArray *)0x110179);
              if (bVar1) {
                pFVar19 = *(FILE **)(in_RDI + 8);
                pcVar4 = QByteArray::constData((QByteArray *)0x1101a3);
                pcVar6 = QByteArray::constData((QByteArray *)0x1101bc);
                local_1fc = (pPVar11->typeTag).super_QFlagsStorageHelper<TypeTag,_4>.
                            super_QFlagsStorage<TypeTag>.i;
                pcVar8 = cxxTypeTag((TypeTags)in_stack_fffffffffffffa3c.i);
                pcVar12 = QByteArray::constData((QByteArray *)0x1101fe);
                fprintf(pFVar19,
                        " QtMocHelpers::setProperty(%s%s, *reinterpret_cast<%s%s*>(_v)); break;\n",
                        pcVar4,pcVar6,pcVar8,pcVar12);
              }
              else {
                pFVar19 = *(FILE **)(in_RDI + 8);
                pcVar4 = QByteArray::constData((QByteArray *)0x110252);
                pcVar6 = QByteArray::constData((QByteArray *)0x110268);
                local_200 = (pPVar11->typeTag).super_QFlagsStorageHelper<TypeTag,_4>.
                            super_QFlagsStorage<TypeTag>.i;
                pcVar8 = cxxTypeTag((TypeTags)in_stack_fffffffffffffa3c.i);
                pcVar12 = QByteArray::constData((QByteArray *)0x1102a7);
                fprintf(pFVar19,
                        "\n            if (QtMocHelpers::setProperty(%s%s, *reinterpret_cast<%s%s*>(_v)))\n"
                        ,pcVar4,pcVar6,pcVar8,pcVar12);
                pFVar19 = *(FILE **)(in_RDI + 8);
                pcVar4 = QByteArray::constData((QByteArray *)0x1102f7);
                fprintf(pFVar19,"                Q_EMIT _t->%s(",pcVar4);
                if (-1 < pPVar11->notifyId) {
                  pFVar7 = QList<FunctionDef>::at
                                     ((QList<FunctionDef> *)in_stack_fffffffffffffa20,
                                      (qsizetype)in_stack_fffffffffffffa18);
                  qVar5 = QList<ArgumentDef>::size(&pFVar7->arguments);
                  if (qVar5 == 1) {
                    QList<ArgumentDef>::at
                              ((QList<ArgumentDef> *)in_stack_fffffffffffffa20,
                               (qsizetype)in_stack_fffffffffffffa18);
                    bVar1 = ::operator==((QByteArray *)in_stack_fffffffffffffa30,
                                         in_stack_fffffffffffffa28);
                    if (bVar1) {
                      pFVar19 = *(FILE **)(in_RDI + 8);
                      pcVar4 = QByteArray::constData((QByteArray *)0x1103d2);
                      pcVar6 = QByteArray::constData((QByteArray *)0x1103e8);
                      fprintf(pFVar19,"%s%s",pcVar4,pcVar6);
                    }
                  }
                }
                fprintf(*(FILE **)(in_RDI + 8),");\n");
                fprintf(*(FILE **)(in_RDI + 8),"            break;\n");
              }
            }
            else {
              pFVar19 = *(FILE **)(in_RDI + 8);
              pcVar4 = QByteArray::constData((QByteArray *)0x1100ab);
              pcVar6 = QByteArray::constData((QByteArray *)0x1100c4);
              local_1f8 = (pPVar11->typeTag).super_QFlagsStorageHelper<TypeTag,_4>.
                          super_QFlagsStorage<TypeTag>.i;
              pcVar8 = cxxTypeTag((TypeTags)in_stack_fffffffffffffa3c.i);
              in_stack_fffffffffffffa18 =
                   (QStringBuilder<QStringBuilder<const_QByteArray_&,_char>,_const_QByteArray_&> *)
                   QByteArray::constData((QByteArray *)0x110106);
              fprintf(pFVar19,"        case %d: %s%s(*reinterpret_cast<%s%s*>(_v)); break;\n",
                      (ulong)local_2ec,pcVar4,pcVar6,pcVar8);
            }
          }
          QByteArray::~QByteArray((QByteArray *)0x11044a);
        }
      }
      fprintf(*(FILE **)(in_RDI + 8),"        default: break;\n");
      fprintf(*(FILE **)(in_RDI + 8),"        }\n");
      fprintf(*(FILE **)(in_RDI + 8),"    }\n");
    }
    if (bVar15) {
      fprintf(*(FILE **)(in_RDI + 8),"if (_c == QMetaObject::ResetProperty) {\n");
      fprintf(*(FILE **)(in_RDI + 8),"        switch (_id) {\n");
      local_304 = 0;
      while (uVar18 = local_304,
            qVar5 = QList<PropertyDef>::size
                              ((QList<PropertyDef> *)(*(long *)(in_RDI + 0x10) + 0x188)),
            (int)uVar18 < (int)qVar5) {
        pPVar11 = QList<PropertyDef>::at
                            ((QList<PropertyDef> *)in_stack_fffffffffffffa20,
                             (qsizetype)in_stack_fffffffffffffa18);
        bVar1 = QByteArray::isEmpty((QByteArray *)0x11057b);
        if (!bVar1) {
          local_218 = &DAT_aaaaaaaaaaaaaaaa;
          local_210 = &DAT_aaaaaaaaaaaaaaaa;
          local_208 = &DAT_aaaaaaaaaaaaaaaa;
          QByteArray::QByteArray
                    ((QByteArray *)in_stack_fffffffffffffa30,(char *)in_stack_fffffffffffffa28,
                     (qsizetype)in_stack_fffffffffffffa20);
          qVar5 = QByteArray::size(&pPVar11->inPrivateClass);
          if (qVar5 != 0) {
            local_228 = ::operator+((QByteArray *)in_stack_fffffffffffffa20,
                                    (char (*) [3])in_stack_fffffffffffffa18);
            ::operator+=((QByteArray *)in_stack_fffffffffffffa20,
                         (QStringBuilder<const_QByteArray_&,_const_char_(&)[3]> *)
                         in_stack_fffffffffffffa18);
          }
          pFVar19 = *(FILE **)(in_RDI + 8);
          pcVar4 = QByteArray::constData((QByteArray *)0x110651);
          pcVar6 = QByteArray::constData((QByteArray *)0x11066a);
          fprintf(pFVar19,"        case %d: %s%s(); break;\n",(ulong)local_304,pcVar4,pcVar6);
          QByteArray::~QByteArray((QByteArray *)0x110696);
        }
        local_304 = local_304 + 1;
      }
      fprintf(*(FILE **)(in_RDI + 8),"        default: break;\n");
      fprintf(*(FILE **)(in_RDI + 8),"        }\n");
      fprintf(*(FILE **)(in_RDI + 8),"    }\n");
    }
    if (bVar16) {
      fprintf(*(FILE **)(in_RDI + 8),"    if (_c == QMetaObject::BindableProperty) {\n");
      fprintf(*(FILE **)(in_RDI + 8),"        switch (_id) {\n");
      for (local_314 = 0;
          qVar5 = QList<PropertyDef>::size((QList<PropertyDef> *)(*(long *)(in_RDI + 0x10) + 0x188))
          , (int)local_314 < (int)qVar5; local_314 = local_314 + 1) {
        pPVar11 = QList<PropertyDef>::at
                            ((QList<PropertyDef> *)in_stack_fffffffffffffa20,
                             (qsizetype)in_stack_fffffffffffffa18);
        bVar1 = QByteArray::isEmpty((QByteArray *)0x1107c4);
        if (!bVar1) {
          local_240 = &DAT_aaaaaaaaaaaaaaaa;
          local_238 = &DAT_aaaaaaaaaaaaaaaa;
          local_230 = &DAT_aaaaaaaaaaaaaaaa;
          QByteArray::QByteArray
                    ((QByteArray *)in_stack_fffffffffffffa30,(char *)in_stack_fffffffffffffa28,
                     (qsizetype)in_stack_fffffffffffffa20);
          qVar5 = QByteArray::size(&pPVar11->inPrivateClass);
          if (qVar5 != 0) {
            local_250 = ::operator+((QByteArray *)in_stack_fffffffffffffa20,
                                    (char (*) [3])in_stack_fffffffffffffa18);
            ::operator+=((QByteArray *)in_stack_fffffffffffffa20,
                         (QStringBuilder<const_QByteArray_&,_const_char_(&)[3]> *)
                         in_stack_fffffffffffffa18);
          }
          in_stack_fffffffffffffa30 = *(FILE **)(in_RDI + 8);
          uVar18 = local_314;
          pcVar4 = QByteArray::constData((QByteArray *)0x11089a);
          pcVar6 = QByteArray::constData((QByteArray *)0x1108b0);
          fprintf(in_stack_fffffffffffffa30,
                  "        case %d: *static_cast<QUntypedBindable *>(_a[0]) = %s%s(); break;\n",
                  (ulong)uVar18,pcVar4,pcVar6);
          QByteArray::~QByteArray((QByteArray *)0x1108dc);
        }
      }
      fprintf(*(FILE **)(in_RDI + 8),"        default: break;\n");
      fprintf(*(FILE **)(in_RDI + 8),"        }\n");
      fprintf(*(FILE **)(in_RDI + 8),"    }\n");
    }
  }
  local_268[0] = &local_34;
  entry = (UsedArgs)((ulong)local_268 >> 0x20);
  generateStaticMetacall::anon_class_16_2_a78287bd::operator()
            ((anon_class_16_2_a78287bd *)in_stack_fffffffffffffa30,entry,
             (char *)in_stack_fffffffffffffa20);
  generateStaticMetacall::anon_class_16_2_a78287bd::operator()
            ((anon_class_16_2_a78287bd *)in_stack_fffffffffffffa30,entry,
             (char *)in_stack_fffffffffffffa20);
  generateStaticMetacall::anon_class_16_2_a78287bd::operator()
            ((anon_class_16_2_a78287bd *)in_stack_fffffffffffffa30,entry,
             (char *)in_stack_fffffffffffffa20);
  generateStaticMetacall::anon_class_16_2_a78287bd::operator()
            ((anon_class_16_2_a78287bd *)in_stack_fffffffffffffa30,entry,
             (char *)in_stack_fffffffffffffa20);
  fprintf(*(FILE **)(in_RDI + 8),"}\n");
  QMultiMap<QByteArray,_int>::~QMultiMap((QMultiMap<QByteArray,_int> *)0x1109f8);
  QList<FunctionDef>::~QList((QList<FunctionDef> *)0x110a05);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
code_r0x0010eb2f:
  QMultiMap<QByteArray,_int>::const_iterator::key((const_iterator *)0x10eb3c);
  bVar1 = ::operator!=((QByteArray *)CONCAT44(in_stack_fffffffffffffa3c.i,in_stack_fffffffffffffa38)
                       ,(QByteArray *)in_stack_fffffffffffffa30);
  if (bVar1) {
LAB_0010eb52:
    pFVar19 = *(FILE **)(in_RDI + 8);
    pcVar4 = QByteArray::constData((QByteArray *)0x10eb73);
    fprintf(pFVar19,
            "                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< %s >(); break;\n"
            ,pcVar4);
  }
  goto LAB_0010ea8b;
code_r0x0010f22b:
  QMultiMap<QByteArray,_int>::const_iterator::key((const_iterator *)0x10f238);
  bVar1 = ::operator!=((QByteArray *)CONCAT44(in_stack_fffffffffffffa3c.i,in_stack_fffffffffffffa38)
                       ,(QByteArray *)in_stack_fffffffffffffa30);
  if (bVar1) {
LAB_0010f24e:
    pFVar19 = *(FILE **)(in_RDI + 8);
    pcVar4 = QByteArray::constData((QByteArray *)0x10f26f);
    fprintf(pFVar19,
            "            *reinterpret_cast<int*>(_a[0]) = qRegisterMetaType< %s >(); break;\n",
            pcVar4);
  }
  goto LAB_0010f187;
}

Assistant:

void Generator::generateStaticMetacall()
{
    fprintf(out, "void %s::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)\n{\n",
            cdef->qualified.constData());

    enum UsedArgs {
        UsedT = 1,
        UsedC = 2,
        UsedId = 4,
        UsedA = 8,
    };
    uint usedArgs = 0;

    if (cdef->hasQObject) {
#ifndef QT_NO_DEBUG
        fprintf(out, "    Q_ASSERT(_o == nullptr || staticMetaObject.cast(_o));\n");
#endif
        fprintf(out, "    auto *_t = static_cast<%s *>(_o);\n", cdef->classname.constData());
    } else {
        fprintf(out, "    auto *_t = reinterpret_cast<%s *>(_o);\n", cdef->classname.constData());
    }

    const auto generateCtorArguments = [&](int ctorindex) {
        const FunctionDef &f = cdef->constructorList.at(ctorindex);
        Q_ASSERT(!f.isPrivateSignal); // That would be a strange ctor indeed
        int offset = 1;

        const auto begin = f.arguments.cbegin();
        const auto end = f.arguments.cend();
        for (auto it = begin; it != end; ++it) {
            const ArgumentDef &a = *it;
            if (it != begin)
                fprintf(out, ",");
            fprintf(out, "(*reinterpret_cast<%s>(_a[%d]))",
                    a.typeNameForCast.constData(), offset++);
        }
    };

    if (!cdef->constructorList.isEmpty()) {
        fprintf(out, "    if (_c == QMetaObject::CreateInstance) {\n");
        fprintf(out, "        switch (_id) {\n");
        const int ctorend = int(cdef->constructorList.size());
        for (int ctorindex = 0; ctorindex < ctorend; ++ctorindex) {
            fprintf(out, "        case %d: { %s *_r = new %s(", ctorindex,
                    cdef->classname.constData(), cdef->classname.constData());
            generateCtorArguments(ctorindex);
            fprintf(out, ");\n");
            fprintf(out, "            if (_a[0]) *reinterpret_cast<%s**>(_a[0]) = _r; } break;\n",
                    (cdef->hasQGadget || cdef->hasQNamespace) ? "void" : "QObject");
        }
        fprintf(out, "        default: break;\n");
        fprintf(out, "        }\n");
        fprintf(out, "    }\n");
        fprintf(out, "    if (_c == QMetaObject::ConstructInPlace) {\n");
        fprintf(out, "        switch (_id) {\n");
        for (int ctorindex = 0; ctorindex < ctorend; ++ctorindex) {
            fprintf(out, "        case %d: { new (_a[0]) %s(",
                    ctorindex, cdef->classname.constData());
            generateCtorArguments(ctorindex);
            fprintf(out, "); } break;\n");
        }
        fprintf(out, "        default: break;\n");
        fprintf(out, "        }\n");
        fprintf(out, "    }\n");
        usedArgs |= UsedC | UsedId | UsedA;
    }

    QList<FunctionDef> methodList;
    methodList += cdef->signalList;
    methodList += cdef->slotList;
    methodList += cdef->methodList;

    if (!methodList.isEmpty()) {
        usedArgs |= UsedT | UsedC | UsedId;
        fprintf(out, "    if (_c == QMetaObject::InvokeMetaMethod) {\n");
        fprintf(out, "        switch (_id) {\n");
        for (int methodindex = 0; methodindex < methodList.size(); ++methodindex) {
            const FunctionDef &f = methodList.at(methodindex);
            Q_ASSERT(!f.normalizedType.isEmpty());
            fprintf(out, "        case %d: ", methodindex);
            if (f.normalizedType != "void")
                fprintf(out, "{ %s _r = ", noRef(f.normalizedType).constData());
            fprintf(out, "_t->");
            if (f.inPrivateClass.size())
                fprintf(out, "%s->", f.inPrivateClass.constData());
            fprintf(out, "%s(", f.name.constData());
            int offset = 1;

            if (f.isRawSlot) {
                fprintf(out, "QMethodRawArguments{ _a }");
                usedArgs |= UsedA;
            } else {
                const auto begin = f.arguments.cbegin();
                const auto end = f.arguments.cend();
                for (auto it = begin; it != end; ++it) {
                    const ArgumentDef &a = *it;
                    if (it != begin)
                        fprintf(out, ",");
                    fprintf(out, "(*reinterpret_cast< %s>(_a[%d]))",a.typeNameForCast.constData(), offset++);
                    usedArgs |= UsedA;
                }
                if (f.isPrivateSignal) {
                    if (!f.arguments.isEmpty())
                        fprintf(out, ", ");
                    fprintf(out, "%s", "QPrivateSignal()");
                }
            }
            fprintf(out, ");");
            if (f.normalizedType != "void") {
                fprintf(out, "\n            if (_a[0]) *reinterpret_cast< %s*>(_a[0]) = std::move(_r); } ",
                        noRef(f.normalizedType).constData());
                usedArgs |= UsedA;
            }
            fprintf(out, " break;\n");
        }
        fprintf(out, "        default: ;\n");
        fprintf(out, "        }\n");
        fprintf(out, "    }\n");

        QMap<int, QMultiMap<QByteArray, int> > methodsWithAutomaticTypes = methodsWithAutomaticTypesHelper(methodList);

        if (!methodsWithAutomaticTypes.isEmpty()) {
            fprintf(out, "    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {\n");
            fprintf(out, "        switch (_id) {\n");
            fprintf(out, "        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;\n");
            QMap<int, QMultiMap<QByteArray, int> >::const_iterator it = methodsWithAutomaticTypes.constBegin();
            const QMap<int, QMultiMap<QByteArray, int> >::const_iterator end = methodsWithAutomaticTypes.constEnd();
            for ( ; it != end; ++it) {
                fprintf(out, "        case %d:\n", it.key());
                fprintf(out, "            switch (*reinterpret_cast<int*>(_a[1])) {\n");
                fprintf(out, "            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;\n");
                auto jt = it->begin();
                const auto jend = it->end();
                while (jt != jend) {
                    fprintf(out, "            case %d:\n", jt.value());
                    const QByteArray &lastKey = jt.key();
                    ++jt;
                    if (jt == jend || jt.key() != lastKey)
                        fprintf(out, "                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< %s >(); break;\n", lastKey.constData());
                }
                fprintf(out, "            }\n");
                fprintf(out, "            break;\n");
            }
            fprintf(out, "        }\n");
            fprintf(out, "    }\n");
            usedArgs |= UsedC | UsedId | UsedA;
        }

    }
    if (!cdef->signalList.isEmpty()) {
        usedArgs |= UsedC | UsedA;
        fprintf(out, "    if (_c == QMetaObject::IndexOfMethod) {\n");
        for (int methodindex = 0; methodindex < int(cdef->signalList.size()); ++methodindex) {
            const FunctionDef &f = cdef->signalList.at(methodindex);
            if (f.wasCloned || !f.inPrivateClass.isEmpty() || f.isStatic)
                continue;
            fprintf(out, "        if (QtMocHelpers::indexOfMethod<%s (%s::*)(",
                    f.type.rawName.constData() , cdef->classname.constData());

            const auto begin = f.arguments.cbegin();
            const auto end = f.arguments.cend();
            for (auto it = begin; it != end; ++it) {
                const ArgumentDef &a = *it;
                if (it != begin)
                    fprintf(out, ", ");
                fprintf(out, "%s", QByteArray(a.type.name + ' ' + a.rightType).constData());
            }
            if (f.isPrivateSignal) {
                if (!f.arguments.isEmpty())
                    fprintf(out, ", ");
                fprintf(out, "%s", "QPrivateSignal");
            }
            fprintf(out, ")%s>(_a, &%s::%s, %d))\n",
                    f.isConst ? " const" : "",
                    cdef->classname.constData(), f.name.constData(), methodindex);
            fprintf(out, "            return;\n");
        }
        fprintf(out, "    }\n");
    }

    const QMultiMap<QByteArray, int> automaticPropertyMetaTypes = automaticPropertyMetaTypesHelper();

    if (!automaticPropertyMetaTypes.isEmpty()) {
        fprintf(out, "    if (_c == QMetaObject::RegisterPropertyMetaType) {\n");
        fprintf(out, "        switch (_id) {\n");
        fprintf(out, "        default: *reinterpret_cast<int*>(_a[0]) = -1; break;\n");
        auto it = automaticPropertyMetaTypes.begin();
        const auto end = automaticPropertyMetaTypes.end();
        while (it != end) {
            fprintf(out, "        case %d:\n", it.value());
            const QByteArray &lastKey = it.key();
            ++it;
            if (it == end || it.key() != lastKey)
                fprintf(out, "            *reinterpret_cast<int*>(_a[0]) = qRegisterMetaType< %s >(); break;\n", lastKey.constData());
        }
        fprintf(out, "        }\n");
        fprintf(out, "    }\n");
        usedArgs |= UsedC | UsedId | UsedA;
    }

    if (!cdef->propertyList.empty()) {
        bool needGet = false;
        bool needTempVarForGet = false;
        bool needSet = false;
        bool needReset = false;
        bool hasBindableProperties = false;
        for (const PropertyDef &p : std::as_const(cdef->propertyList)) {
            needGet |= !p.read.isEmpty() || !p.member.isEmpty();
            if (!p.read.isEmpty() || !p.member.isEmpty())
                needTempVarForGet |= (p.gspec != PropertyDef::PointerSpec
                                      && p.gspec != PropertyDef::ReferenceSpec);

            needSet |= !p.write.isEmpty() || (!p.member.isEmpty() && !p.constant);
            needReset |= !p.reset.isEmpty();
            hasBindableProperties |= !p.bind.isEmpty();
        }
        if (needGet || needSet || hasBindableProperties || needReset)
            usedArgs |= UsedT | UsedC | UsedId;
        if (needGet || needSet || hasBindableProperties)
            usedArgs |= UsedA;  // resetting doesn't need arguments

        if (needGet) {
            fprintf(out, "    if (_c == QMetaObject::ReadProperty) {\n");
            if (needTempVarForGet)
                fprintf(out, "        void *_v = _a[0];\n");
            fprintf(out, "        switch (_id) {\n");
            for (int propindex = 0; propindex < int(cdef->propertyList.size()); ++propindex) {
                const PropertyDef &p = cdef->propertyList.at(propindex);
                if (p.read.isEmpty() && p.member.isEmpty())
                    continue;
                QByteArray prefix = "_t->";
                if (p.inPrivateClass.size()) {
                    prefix += p.inPrivateClass + "->";
                }

                if (p.gspec == PropertyDef::PointerSpec)
                    fprintf(out, "        case %d: _a[0] = const_cast<void*>(reinterpret_cast<const void*>(%s%s())); break;\n",
                            propindex, prefix.constData(), p.read.constData());
                else if (p.gspec == PropertyDef::ReferenceSpec)
                    fprintf(out, "        case %d: _a[0] = const_cast<void*>(reinterpret_cast<const void*>(&%s%s())); break;\n",
                            propindex, prefix.constData(), p.read.constData());
#if QT_VERSION <= QT_VERSION_CHECK(7, 0, 0)
                else if (auto eflags = cdef->enumDeclarations.value(p.type); eflags & EnumIsFlag)
                    fprintf(out, "        case %d: QtMocHelpers::assignFlags<%s>(_v, %s%s()); break;\n",
                            propindex, p.type.constData(), prefix.constData(), p.read.constData());
#endif
                else if (p.read == "default")
                    fprintf(out, "        case %d: *reinterpret_cast<%s%s*>(_v) = %s%s().value(); break;\n",
                            propindex, cxxTypeTag(p.typeTag), p.type.constData(),
                            prefix.constData(), p.bind.constData());
                else if (!p.read.isEmpty())
                    fprintf(out, "        case %d: *reinterpret_cast<%s%s*>(_v) = %s%s(); break;\n",
                            propindex, cxxTypeTag(p.typeTag), p.type.constData(),
                            prefix.constData(), p.read.constData());
                else
                    fprintf(out, "        case %d: *reinterpret_cast<%s%s*>(_v) = %s%s; break;\n",
                            propindex, cxxTypeTag(p.typeTag), p.type.constData(),
                            prefix.constData(), p.member.constData());
            }
            fprintf(out, "        default: break;\n");
            fprintf(out, "        }\n");
            fprintf(out, "    }\n");
        }

        if (needSet) {
            fprintf(out, "    if (_c == QMetaObject::WriteProperty) {\n");
            fprintf(out, "        void *_v = _a[0];\n");
            fprintf(out, "        switch (_id) {\n");
            for (int propindex = 0; propindex < int(cdef->propertyList.size()); ++propindex) {
                const PropertyDef &p = cdef->propertyList.at(propindex);
                if (p.constant)
                    continue;
                if (p.write.isEmpty() && p.member.isEmpty())
                    continue;
                QByteArray prefix = "_t->";
                if (p.inPrivateClass.size()) {
                    prefix += p.inPrivateClass + "->";
                }
                if (p.write == "default") {
                    fprintf(out, "        case %d: {\n", propindex);
                    fprintf(out, "            %s%s().setValue(*reinterpret_cast<%s%s*>(_v));\n",
                            prefix.constData(), p.bind.constData(), cxxTypeTag(p.typeTag), p.type.constData());
                    fprintf(out, "            break;\n");
                    fprintf(out, "        }\n");
                } else if (!p.write.isEmpty()) {
                    fprintf(out, "        case %d: %s%s(*reinterpret_cast<%s%s*>(_v)); break;\n",
                            propindex, prefix.constData(), p.write.constData(),
                            cxxTypeTag(p.typeTag), p.type.constData());
                } else {
                    fprintf(out, "        case %d:", propindex);
                    if (p.notify.isEmpty()) {
                        fprintf(out, " QtMocHelpers::setProperty(%s%s, *reinterpret_cast<%s%s*>(_v)); break;\n",
                                prefix.constData(), p.member.constData(), cxxTypeTag(p.typeTag), p.type.constData());
                    } else {
                        fprintf(out, "\n            if (QtMocHelpers::setProperty(%s%s, *reinterpret_cast<%s%s*>(_v)))\n",
                                prefix.constData(), p.member.constData(), cxxTypeTag(p.typeTag), p.type.constData());
                        fprintf(out, "                Q_EMIT _t->%s(", p.notify.constData());
                        if (p.notifyId > -1) {
                            const FunctionDef &f = cdef->signalList.at(p.notifyId);
                            if (f.arguments.size() == 1 && f.arguments.at(0).normalizedType == p.type)
                                fprintf(out, "%s%s", prefix.constData(), p.member.constData());
                        }
                        fprintf(out, ");\n");
                        fprintf(out, "            break;\n");
                    }
                }
            }
            fprintf(out, "        default: break;\n");
            fprintf(out, "        }\n");
            fprintf(out, "    }\n");
        }

        if (needReset) {
            fprintf(out, "if (_c == QMetaObject::ResetProperty) {\n");
            fprintf(out, "        switch (_id) {\n");
            for (int propindex = 0; propindex < int(cdef->propertyList.size()); ++propindex) {
                const PropertyDef &p = cdef->propertyList.at(propindex);
                if (p.reset.isEmpty())
                    continue;
                QByteArray prefix = "_t->";
                if (p.inPrivateClass.size()) {
                    prefix += p.inPrivateClass + "->";
                }
                fprintf(out, "        case %d: %s%s(); break;\n",
                        propindex, prefix.constData(), p.reset.constData());
            }
            fprintf(out, "        default: break;\n");
            fprintf(out, "        }\n");
            fprintf(out, "    }\n");
        }

        if (hasBindableProperties) {
            fprintf(out, "    if (_c == QMetaObject::BindableProperty) {\n");
            fprintf(out, "        switch (_id) {\n");
            for (int propindex = 0; propindex < int(cdef->propertyList.size()); ++propindex) {
                const PropertyDef &p = cdef->propertyList.at(propindex);
                if (p.bind.isEmpty())
                    continue;
                QByteArray prefix = "_t->";
                if (p.inPrivateClass.size()) {
                    prefix += p.inPrivateClass + "->";
                }
                fprintf(out,
                        "        case %d: *static_cast<QUntypedBindable *>(_a[0]) = %s%s(); "
                        "break;\n",
                        propindex, prefix.constData(), p.bind.constData());
            }
            fprintf(out, "        default: break;\n");
            fprintf(out, "        }\n");
            fprintf(out, "    }\n");
        }
    }

    auto printUnused = [&](UsedArgs entry, const char *name) {
        if ((usedArgs & entry) == 0)
            fprintf(out, "    (void)%s;\n", name);
    };
    printUnused(UsedT, "_t");
    printUnused(UsedC, "_c");
    printUnused(UsedId, "_id");
    printUnused(UsedA, "_a");

    fprintf(out, "}\n");
}